

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_write.c
# Opt level: O0

int write_dword(FILE *fp,uint32_t v)

{
  size_t sVar1;
  undefined1 local_18;
  undefined1 local_17;
  undefined1 local_16;
  undefined1 local_15;
  uint32_t local_14;
  uint8_t b [4];
  uint32_t v_local;
  FILE *fp_local;
  
  local_18 = (undefined1)v;
  local_17 = (undefined1)(v >> 8);
  local_16 = (undefined1)(v >> 0x10);
  local_15 = (undefined1)(v >> 0x18);
  local_14 = v;
  _b = fp;
  sVar1 = fwrite(&local_18,1,4,(FILE *)fp);
  return (int)sVar1;
}

Assistant:

int write_dword(FILE* fp, uint32_t v)
{
    uint8_t b[4];

    b[0] = v & 0xff;
    b[1] = (v >> 8) & 0xff;
    b[2] = (v >> 16) & 0xff;
    b[3] = (v >> 24) & 0xff;

    return fwrite(b, 1, 4, fp);
}